

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O0

void * parseDictionary(SymbolContext<char> *ctx)

{
  int iVar1;
  unordered_map<std::__cxx11::string,JSONValue,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>>
  *this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>
  *this_00;
  JSONValue *this_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>
  *p;
  int i;
  JSONObject *o;
  SymbolContext<char> *ctx_local;
  
  this = (unordered_map<std::__cxx11::string,JSONValue,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>>
          *)operator_new(0x38);
  memset(this,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>_>_>
                   *)this);
  p._4_4_ = 1;
  while( true ) {
    iVar1 = Centaurus::SymbolContext<char>::count(ctx);
    if (iVar1 < p._4_4_) break;
    this_00 = Centaurus::SymbolContext<char>::value<std::pair<std::__cxx11::string,JSONValue>>
                        (ctx,p._4_4_);
    std::
    unordered_map<std::__cxx11::string,JSONValue,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>>
    ::emplace<std::__cxx11::string&,JSONValue>(this,&this_00->first,&this_00->second);
    if (this_00 !=
        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>
         *)0x0) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>
      ::~pair(this_00);
      operator_delete(this_00);
    }
    p._4_4_ = p._4_4_ + 1;
  }
  this_01 = (JSONValue *)operator_new(0x10);
  JSONValue::JSONValue(this_01,(JSONObject *)this);
  return this_01;
}

Assistant:

void *parseDictionary(const SymbolContext<char>& ctx)
{
    JSONObject *o = new JSONObject();
    for (int i = 1; i <= ctx.count(); i++)
    {
        std::pair<JSONString, JSONValue> *p = ctx.value<std::pair<JSONString, JSONValue> >(i);
        o->emplace(p->first, std::move(p->second));
        delete p;
    }
    return new JSONValue(o);
}